

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_lcp_2way_unstable_parallel<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_input_00;
  uchar **strings_output_00;
  lcp_t *lcp_input_00;
  MergeResult MVar1;
  MergeResult MVar2;
  lcp_t lVar3;
  lcp_t *lcp_output_00;
  size_t n_00;
  ulong uVar4;
  uint uVar5;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    for (uVar5 = 1; uVar4 = (ulong)(uVar5 - 1), uVar4 < n - 1; uVar5 = uVar5 + 1) {
      lVar3 = lcp(strings_input[uVar4],strings_input[uVar5]);
      lcp_input[uVar4] = lVar3;
    }
LAB_001d28ae:
    MVar1 = SortedInPlace;
  }
  else {
    uVar4 = n >> 1;
    MVar1 = mergesort_lcp_2way_unstable_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar4);
    strings_input_00 = strings_input + uVar4;
    strings_output_00 = strings_output + uVar4;
    lcp_input_00 = lcp_input + uVar4;
    lcp_output_00 = lcp_output + uVar4;
    n_00 = n - uVar4;
    MVar2 = mergesort_lcp_2way_unstable_parallel<true>
                      (strings_input_00,strings_output_00,lcp_input_00,lcp_output_00,n_00);
    if (MVar1 == MVar2) {
      if (MVar1 != SortedInPlace) {
        merge_lcp_2way_unstable<true>
                  (strings_output,lcp_output,uVar4,strings_output_00,lcp_output_00,n_00,
                   strings_input,lcp_input);
        goto LAB_001d28ae;
      }
    }
    else {
      if (MVar1 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x700,
                      "MergeResult mergesort_lcp_2way_unstable_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      memcpy(strings_input_00,strings_output_00,n_00 * 8);
      memcpy(lcp_input_00,lcp_output_00,n_00 * 8);
    }
    merge_lcp_2way_unstable<true>
              (strings_input,lcp_input,uVar4,strings_input_00,lcp_input_00,n_00,strings_output,
               lcp_output);
    MVar1 = SortedInTemp;
  }
  return MVar1;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable_parallel(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml, mr;
#pragma omp task shared(ml)
	ml = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);
#pragma omp task shared(mr)
	mr = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);
#pragma omp taskwait
	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}